

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyVarcharOperator>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  ulong row_idx;
  idx_t iVar6;
  
  pdVar1 = (vector_data->format).data;
  for (iVar6 = chunk.start; iVar6 < chunk.end; iVar6 = iVar6 + 1) {
    psVar2 = ((vector_data->format).sel)->sel_vector;
    row_idx = iVar6;
    if (psVar2 != (sel_t *)0x0) {
      row_idx = (ulong)psVar2[iVar6];
    }
    uVar5 = iVar6;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar5 = chunk.result_index;
    }
    puVar3 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5;
    *puVar3 = *puVar3 + 1;
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                       row_idx);
    if (bVar4) {
      puVar3 = (result->variable_lengths).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3[uVar5] = (ulong)*(uint *)(pdVar1 + row_idx * 0x10) + puVar3[uVar5] + 1;
    }
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}